

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_clipper.cpp
# Opt level: O2

void __thiscall Clipper::RemoveClipRange(Clipper *this,angle_t start,angle_t end)

{
  uint uVar1;
  ClipNode *pCVar2;
  
  pCVar2 = this->silhouette;
  if (pCVar2 != (ClipNode *)0x0) {
    while( true ) {
      if (pCVar2 == (ClipNode *)0x0) {
        pCVar2 = (ClipNode *)0x0;
        goto LAB_003e752f;
      }
      uVar1 = pCVar2->end;
      if (start < uVar1) break;
      pCVar2 = pCVar2->next;
    }
    if (start < pCVar2->start) goto LAB_003e752f;
    if (uVar1 < end) {
      while( true ) {
        pCVar2 = pCVar2->next;
        start = uVar1;
LAB_003e752f:
        if ((pCVar2 == (ClipNode *)0x0) || (end <= pCVar2->start)) break;
        DoRemoveClipRange(this,start,pCVar2->start);
        uVar1 = pCVar2->end;
      }
      if (start < end) goto LAB_003e754e;
    }
    return;
  }
LAB_003e754e:
  DoRemoveClipRange(this,start,end);
  return;
}

Assistant:

void Clipper::RemoveClipRange(angle_t start, angle_t end)
{
	ClipNode *node;

	if (silhouette)
	{
		node = silhouette;
		while (node != NULL && node->end <= start)
		{
			node = node->next;
		}
		if (node != NULL && node->start <= start)
		{
			if (node->end >= end) return;
			start = node->end;
			node = node->next;
		}
		while (node != NULL && node->start < end)
		{
			DoRemoveClipRange(start, node->start);
			start = node->end;
			node = node->next;
		}
		if (start >= end) return;
	}
	DoRemoveClipRange(start, end);
}